

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O2

void __thiscall xray_re::xr_bone::load_data(xr_bone *this,xr_reader *r)

{
  uint32_t uVar1;
  float *pfVar2;
  uint __line;
  size_t sVar3;
  long lVar4;
  uint32_t *puVar5;
  s_bone_shape *psVar6;
  byte bVar7;
  
  bVar7 = 0;
  sVar3 = xr_reader::find_chunk(r,2,(bool *)0x0,false);
  if (sVar3 == 0) {
    __line = 0x40;
  }
  else {
    xr_reader::r_sz(r,&this->m_name);
    sVar3 = xr_reader::find_chunk(r,4);
    if (sVar3 == 0) {
      __line = 0x45;
    }
    else {
      xr_reader::r_sz(r,&this->m_gamemtl);
      sVar3 = xr_reader::find_chunk(r,5);
      if (sVar3 == 0) {
        __line = 0x4a;
      }
      else {
        puVar5 = (r->field_2).m_p_u32;
        psVar6 = &this->m_shape;
        for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
          uVar1 = *puVar5;
          psVar6->type = (short)uVar1;
          psVar6->flags = (short)(uVar1 >> 0x10);
          puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
          psVar6 = (s_bone_shape *)((long)psVar6 + (ulong)bVar7 * -8 + 4);
        }
        (r->field_2).m_p = (r->field_2).m_p + 0x70;
        sVar3 = xr_reader::find_chunk(r,8);
        if (sVar3 != 0) {
          puVar5 = (r->field_2).m_p_u32;
          (r->field_2).m_p = (uint8_t *)(puVar5 + 1);
          (this->m_joint_ik_data).ik_flags = *puVar5;
        }
        sVar3 = xr_reader::find_chunk(r,6);
        if (sVar3 != 0) {
          puVar5 = (r->field_2).m_p_u32;
          (r->field_2).m_p = (uint8_t *)(puVar5 + 1);
          (this->m_joint_ik_data).type = *puVar5;
          xr_reader::r_cseq<xray_re::s_joint_limit>(r,3,(this->m_joint_ik_data).limits);
          pfVar2 = (float *)(r->field_2).m_p_u32;
          (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
          (this->m_joint_ik_data).spring_factor = *pfVar2;
          pfVar2 = (float *)(r->field_2).m_p_u32;
          (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
          (this->m_joint_ik_data).damping_factor = *pfVar2;
          sVar3 = xr_reader::find_chunk(r,9);
          if (sVar3 != 0) {
            pfVar2 = (float *)(r->field_2).m_p_u32;
            (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
            (this->m_joint_ik_data).break_force = *pfVar2;
            pfVar2 = (float *)(r->field_2).m_p_u32;
            (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
            (this->m_joint_ik_data).break_torque = *pfVar2;
          }
          sVar3 = xr_reader::find_chunk(r,0x10);
          if (sVar3 != 0) {
            pfVar2 = (float *)(r->field_2).m_p_u32;
            (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
            (this->m_joint_ik_data).friction = *pfVar2;
          }
          sVar3 = xr_reader::find_chunk(r,7);
          if (sVar3 != 0) {
            pfVar2 = (float *)(r->field_2).m_p_u32;
            (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
            this->m_mass = *pfVar2;
            xr_reader::r_fvector3(r,&this->m_center_of_mass);
            return;
          }
          return;
        }
        __line = 0x54;
      }
    }
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_bone.cxx"
                ,__line,"void xray_re::xr_bone::load_data(xr_reader &)");
}

Assistant:

void xr_bone::load_data(xr_reader& r)
{
	if (!r.find_chunk(BONE_CHUNK_DEF, 0, false))
		xr_not_expected();
	r.r_sz(m_name);
	r.debug_find_chunk();

	if (!r.find_chunk(BONE_CHUNK_MATERIAL))
		xr_not_expected();
	r.r_sz(m_gamemtl);
	r.debug_find_chunk();

	if (!r.find_chunk(BONE_CHUNK_SHAPE))
		xr_not_expected();
	r.r<s_bone_shape>(m_shape);
	r.debug_find_chunk();

	if (r.find_chunk(BONE_CHUNK_IK_FLAGS)) {
		m_joint_ik_data.ik_flags = r.r_u32();
		r.debug_find_chunk();
	}

	if (!r.find_chunk(BONE_CHUNK_IK_JOINT))
		xr_not_expected();
	m_joint_ik_data.type = r.r_u32();
	r.r_cseq<s_joint_limit>(3, m_joint_ik_data.limits);
	m_joint_ik_data.spring_factor = r.r_float();
	m_joint_ik_data.damping_factor = r.r_float();
	r.debug_find_chunk();

	if (r.find_chunk(BONE_CHUNK_BREAK_PARAMS)) {
		m_joint_ik_data.break_force = r.r_float();
		m_joint_ik_data.break_torque = r.r_float();
		r.debug_find_chunk();
	}

	if (r.find_chunk(BONE_CHUNK_FRICTION)) {
		m_joint_ik_data.friction = r.r_float();
		r.debug_find_chunk();
	}

	if (r.find_chunk(BONE_CHUNK_MASS_PARAMS)) {
		m_mass = r.r_float();
		r.r_fvector3(m_center_of_mass);
		r.debug_find_chunk();
	}
}